

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void getQR(double *A,int M,int N,double *bvec,double *Q,double *R)

{
  int iVar1;
  void *__ptr;
  double *B;
  double *A_00;
  double *C;
  double *w;
  double *AT;
  double *v;
  double *x;
  int u;
  int t;
  int k;
  int j;
  int i;
  double *R_local;
  double *Q_local;
  double *bvec_local;
  int N_local;
  int M_local;
  double *A_local;
  
  __ptr = malloc((long)M << 3);
  B = (double *)malloc((long)M << 3);
  A_00 = (double *)malloc((long)M * 8 * (long)N);
  C = (double *)malloc((long)M * 8 * (long)M);
  for (k = 0; k < N; k = k + 1) {
    iVar1 = k * N;
    for (t = 0; t < N; t = t + 1) {
      if (t < k) {
        R[iVar1 + t] = 0.0;
      }
      else {
        R[iVar1 + t] = A[iVar1 + t];
      }
    }
  }
  for (k = 0; k < M; k = k + 1) {
    for (t = 0; t < N; t = t + 1) {
      if (k == t) {
        Q[k * N + t] = 1.0;
      }
      else {
        Q[k * N + t] = 0.0;
      }
    }
  }
  for (t = N + -1; -1 < t; t = t + -1) {
    *B = 1.0;
    k = t;
    while (k = k + 1, k < M) {
      B[k - t] = A[k * N + t];
    }
    for (k = t; k < M; k = k + 1) {
      x._4_4_ = 0;
      for (u = t; u < N; u = u + 1) {
        A_00[(x._4_4_ + k) - t] = Q[u + k * N];
        x._4_4_ = (M - t) + x._4_4_;
      }
    }
    mmult(A_00,B,C,N - t,M - t,1);
    scale(C,N - t,1,bvec[t]);
    mmult(B,C,A_00,M - t,1,N - t);
    for (k = t; k < M; k = k + 1) {
      for (u = t; u < N; u = u + 1) {
        iVar1 = k * N + u;
        Q[iVar1] = Q[iVar1] - A_00[((k - t) * (N - t) + u) - t];
      }
    }
  }
  free(__ptr);
  free(B);
  free(A_00);
  free(C);
  return;
}

Assistant:

void getQR(double *A,int M,int N,double *bvec,double *Q, double *R) {
	int i,j,k,t,u;
	double *x,*v,*AT,*w;
	
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i > j) {
				R[t+j] = 0.;
			} else {
				R[t+j] = A[t+j];
			}
		}
	}
	
	for(i = 0; i < M;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i == j) {
				Q[t+j] = 1.;
			} else {
				Q[t+j] = 0.;
			}
		}
	}
	
	for(j = N-1; j >= 0;--j) {
		v[0] = 1.;
		for(i=j+1;i < M;++i) {
			v[i-j] = A[i*N+j];
			
		}
		
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = Q[k+t];
				u+=(M-j);
			}
			
		}
	
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,bvec[j]);
		mmult(v,w,AT,M-j,1,N-j);
		
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				Q[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
	 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}